

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void print_setup_header(OSQPWorkspace *work)

{
  ulong *puVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  long *in_RDI;
  c_int nnz;
  OSQPSettings *settings;
  OSQPData *data;
  
  puVar1 = (ulong *)*in_RDI;
  puVar2 = (undefined8 *)in_RDI[0x17];
  lVar3 = *(long *)(*(long *)(puVar1[2] + 0x18) + *(long *)(puVar1[2] + 0x10) * 8);
  lVar4 = *(long *)(*(long *)(puVar1[3] + 0x18) + *(long *)(puVar1[3] + 0x10) * 8);
  print_line();
  printf("           OSQP v%s  -  Operator Splitting QP Solver\n              (c) Bartolomeo Stellato,  Goran Banjac\n        University of Oxford  -  Stanford University 2019\n"
         ,"0.6.0");
  print_line();
  printf("problem:  ");
  printf("variables n = %i, constraints m = %i\n          ",*puVar1 & 0xffffffff,
         puVar1[1] & 0xffffffff);
  printf("nnz(P) + nnz(A) = %i\n",lVar3 + lVar4 & 0xffffffff);
  printf("settings: ");
  printf("linear system solver = %s",LINSYS_SOLVER_NAME[*(uint *)(puVar2 + 0xd)]);
  if (*(long *)(in_RDI[1] + 0x28) != 1) {
    printf(" (%d threads)",*(ulong *)(in_RDI[1] + 0x28) & 0xffffffff);
  }
  printf(",\n          ");
  printf("eps_abs = %.1e, eps_rel = %.1e,\n          ",puVar2[8],puVar2[9]);
  printf("eps_prim_inf = %.1e, eps_dual_inf = %.1e,\n          ",puVar2[10],puVar2[0xb]);
  printf("rho = %.2e ",*puVar2);
  if (puVar2[3] != 0) {
    printf("(adaptive)");
  }
  printf(",\n          ");
  printf("sigma = %.2e, alpha = %.2f, ",puVar2[1]);
  printf("max_iter = %i\n",puVar2[7] & 0xffffffff);
  if (puVar2[0x13] == 0) {
    printf("          check_termination: off,\n");
  }
  else {
    printf("          check_termination: on (interval %i),\n",puVar2[0x13] & 0xffffffff);
  }
  if (((double)puVar2[0x15] != 0.0) || (NAN((double)puVar2[0x15]))) {
    printf("          time_limit: %.2e sec,\n",puVar2[0x15]);
  }
  if (puVar2[2] == 0) {
    printf("          scaling: off, ");
  }
  else {
    printf("          scaling: on, ");
  }
  if (puVar2[0x12] == 0) {
    printf("scaled_termination: off\n");
  }
  else {
    printf("scaled_termination: on\n");
  }
  if (puVar2[0x14] == 0) {
    printf("          warm start: off, ");
  }
  else {
    printf("          warm start: on, ");
  }
  if (puVar2[0xf] == 0) {
    printf("polish: off, ");
  }
  else {
    printf("polish: on, ");
  }
  if (((double)puVar2[0x15] != 0.0) || (NAN((double)puVar2[0x15]))) {
    printf("time_limit: %.2e sec\n",puVar2[0x15]);
  }
  else {
    printf("time_limit: off\n");
  }
  printf("\n");
  return;
}

Assistant:

void print_setup_header(const OSQPWorkspace *work) {
  OSQPData *data;
  OSQPSettings *settings;
  c_int nnz; // Number of nonzeros in the problem

  data     = work->data;
  settings = work->settings;

  // Number of nonzeros
  nnz = data->P->p[data->P->n] + data->A->p[data->A->n];

  print_line();
  c_print("           OSQP v%s  -  Operator Splitting QP Solver\n"
          "              (c) Bartolomeo Stellato,  Goran Banjac\n"
          "        University of Oxford  -  Stanford University 2019\n",
          OSQP_VERSION);
  print_line();

  // Print variables and constraints
  c_print("problem:  ");
  c_print("variables n = %i, constraints m = %i\n          ",
                                    (int)data->n,
          (int)data->m);
  c_print("nnz(P) + nnz(A) = %i\n", (int)nnz);

  // Print Settings
  c_print("settings: ");
  c_print("linear system solver = %s",
          LINSYS_SOLVER_NAME[settings->linsys_solver]);

  if (work->linsys_solver->nthreads != 1) {
    c_print(" (%d threads)", (int)work->linsys_solver->nthreads);
  }
  c_print(",\n          ");

  c_print("eps_abs = %.1e, eps_rel = %.1e,\n          ",
          settings->eps_abs, settings->eps_rel);
  c_print("eps_prim_inf = %.1e, eps_dual_inf = %.1e,\n          ",
          settings->eps_prim_inf, settings->eps_dual_inf);
  c_print("rho = %.2e ", settings->rho);

  if (settings->adaptive_rho) c_print("(adaptive)");
  c_print(",\n          ");
  c_print("sigma = %.2e, alpha = %.2f, ",
          settings->sigma, settings->alpha);
  c_print("max_iter = %i\n", (int)settings->max_iter);

  if (settings->check_termination) c_print(
      "          check_termination: on (interval %i),\n",
      (int)settings->check_termination);
  else c_print("          check_termination: off,\n");

# ifdef PROFILING
  if (settings->time_limit) c_print("          time_limit: %.2e sec,\n",
                                    settings->time_limit);
# endif /* ifdef PROFILING */

  if (settings->scaling) c_print("          scaling: on, ");
  else c_print("          scaling: off, ");

  if (settings->scaled_termination) c_print("scaled_termination: on\n");
  else c_print("scaled_termination: off\n");

  if (settings->warm_start) c_print("          warm start: on, ");
  else c_print("          warm start: off, ");

  if (settings->polish) c_print("polish: on, ");
  else c_print("polish: off, ");

  if (settings->time_limit) c_print("time_limit: %.2e sec\n", settings->time_limit);
  else c_print("time_limit: off\n");

  c_print("\n");
}